

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_vocoder.c
# Opt level: O3

void HTS_mc2b(double *mc,double *b,int m,double a)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  
  if (mc == b) {
    if (0 < m && a != 0.0) {
      dVar5 = b[(uint)m];
      uVar1 = (ulong)(uint)m + 1;
      do {
        dVar5 = dVar5 * -a + b[uVar1 - 2];
        b[uVar1 - 2] = dVar5;
        uVar1 = uVar1 - 1;
      } while (1 < uVar1);
    }
  }
  else if ((a != 0.0) || (NAN(a))) {
    b[m] = mc[m];
    if (0 < m) {
      dVar5 = b[(uint)m];
      uVar1 = (ulong)(uint)m + 1;
      do {
        dVar5 = dVar5 * -a + mc[uVar1 - 2];
        b[uVar1 - 2] = dVar5;
        uVar1 = uVar1 - 1;
      } while (1 < uVar1);
    }
  }
  else {
    iVar4 = m + 1;
    lVar2 = (long)iVar4;
    if (b < mc) {
      if (iVar4 != 0) {
        lVar3 = 0;
        do {
          b[lVar3] = mc[lVar3];
          lVar3 = lVar3 + 1;
        } while (lVar2 != lVar3);
      }
    }
    else if (iVar4 != 0) {
      do {
        b[lVar2 + -1] = mc[lVar2 + -1];
        lVar2 = lVar2 + -1;
      } while (lVar2 != 0);
    }
  }
  return;
}

Assistant:

static void HTS_mc2b(double *mc, double *b, int m, const double a)
{
   if (mc != b) {
      if (a != 0.0) {
         b[m] = mc[m];
         for (m--; m >= 0; m--)
            b[m] = mc[m] - a * b[m + 1];
      } else
         HTS_movem(mc, b, m + 1);
   } else if (a != 0.0)
      for (m--; m >= 0; m--)
         b[m] -= a * b[m + 1];
}